

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_interpdump(CHAR_DATA *ch,char *argument)

{
  cmd_type *pcVar1;
  short sVar2;
  FILE *pFVar3;
  climate_type *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  cmd_type *pcVar10;
  long local_40;
  
  pFVar3 = fopen("../logs/interpdump.txt","w");
  pcVar10 = cmd_table;
  do {
    fprintf(pFVar3,";%s;0;do_%s;%d;%d;%d;\n",pcVar10->name,pcVar10->name,
            (ulong)(uint)(int)pcVar10->level,(ulong)(uint)(int)pcVar10->log,
            (uint)(pcVar10->hide == 1) + (uint)(pcVar10->show == 0) * 2);
    pcVar1 = pcVar10 + 1;
    pcVar10 = pcVar10 + 1;
  } while (pcVar1->do_fun != (DO_FUN *)0x0);
  fclose(pFVar3);
  pFVar3 = fopen("../logs/climate-dump.txt","w");
  sVar2 = 0;
  pcVar4 = climate_table;
  lVar6 = 0x48d8ca;
  local_40 = 0x48d912;
  lVar7 = 0;
  do {
    fprintf(pFVar3,"%s;%d;",pcVar4->name,(ulong)(uint)(int)sVar2);
    lVar8 = 0;
    lVar5 = lVar6;
    do {
      if (lVar8 != 0) {
        fputc(0x2c,pFVar3);
      }
      lVar9 = 0;
      do {
        if (lVar9 != 0) {
          fputc(0x7c,pFVar3);
        }
        fprintf(pFVar3,"%d",(ulong)(uint)(int)*(short *)(lVar5 + lVar9));
        lVar9 = lVar9 + 0x12;
      } while (lVar9 != 0x48);
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 2;
    } while (lVar8 != 9);
    fputc(0x3b,pFVar3);
    lVar8 = 0;
    lVar5 = local_40;
    do {
      if (lVar8 != 0) {
        fputc(0x2c,pFVar3);
      }
      lVar9 = 0;
      do {
        if (lVar9 != 0) {
          fputc(0x7c,pFVar3);
        }
        fprintf(pFVar3,"%d",(ulong)(uint)(int)*(short *)(lVar5 + lVar9 * 8));
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 2;
    } while (lVar8 != 4);
    fwrite(";\n",2,1,pFVar3);
    lVar7 = lVar7 + 1;
    pcVar4 = climate_table + lVar7;
    sVar2 = climate_table[lVar7].number;
    lVar6 = lVar6 + 0x78;
    local_40 = local_40 + 0x78;
  } while (sVar2 != 8);
  fclose(pFVar3);
  return;
}

Assistant:

void do_interpdump(CHAR_DATA *ch, char *argument)
{
	FILE *fp = fopen(INTERP_DUMP_FILE, "w");
	int i = 0, j = 0, k = 0;
	int bit = 0;

	for (i = 0; cmd_table[i].do_fun != nullptr; i++)
	{
		bit = 0;

		if (cmd_table[i].show == 0)
			bit += 2;

		if (cmd_table[i].hide == 1)
			bit += 1;

		fprintf(fp, ";%s;0;do_%s;%d;%d;%d;\n", cmd_table[i].name, cmd_table[i].name, cmd_table[i].level, cmd_table[i].log, bit);
	}
	fclose(fp);

	fp = fopen(CLIMATE_DUMP_FILE, "w");

	for (i = 0; climate_table[i].number != Climate::English; i++)
	{
		fprintf(fp, "%s;%d;", climate_table[i].name, climate_table[i].number);

		for (j = 0; j < WeatherCondition::MaxWeatherCondition; j++)
		{
			if (j != 0)
				fprintf(fp, ",");

			for (k = 0; k < Seasons::SeasonsCount; k++)
			{
				if (k != 0)
					fprintf(fp, "|");

				fprintf(fp, "%d", climate_table[i].skyfreqs[k][j]);
			}
		}

		fprintf(fp, ";");

		for (j = 0; j < Temperature::MaxTemperature; j++)
		{
			if (j != 0)
				fprintf(fp, ",");

			for (k = 0; k < Seasons::SeasonsCount; k++)
			{
				if (k != 0)
					fprintf(fp, "|");

				fprintf(fp, "%d", climate_table[i].tempfreqs[k][j]);
			}
		}

		fprintf(fp, ";\n");
	}

	fclose(fp);
}